

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O3

void __thiscall cmCursesLongMessageForm::UpdateStatusBar(cmCursesLongMessageForm *this)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  char fmt_s [3];
  char vertmp [128];
  char version [512];
  char bar [512];
  undefined2 local_4bc;
  undefined1 local_4ba;
  char local_4b8 [128];
  char local_438 [511];
  char acStack_239 [521];
  
  if (_stdscr == 0) {
    iVar6 = -1;
    iVar4 = -1;
  }
  else {
    iVar6 = *(short *)(_stdscr + 4) + 1;
    iVar4 = *(short *)(_stdscr + 6) + 1;
  }
  pcVar3 = (this->Title)._M_dataplus._M_p;
  sVar2 = strlen(pcVar3);
  if (0x1fe < sVar2) {
    sVar2 = 0x1ff;
  }
  strncpy(acStack_239 + 1,pcVar3,sVar2);
  if (sVar2 - 1 < 0x200) {
    memset(acStack_239 + sVar2,0x20,0x201 - sVar2);
  }
  iVar1 = 0x1ff;
  if (iVar4 < 0x1ff) {
    iVar1 = iVar4;
  }
  lVar5 = (long)iVar1;
  acStack_239[lVar5 + 1] = '\0';
  pcVar3 = cmVersion::GetCMakeVersion();
  sprintf(local_4b8,"CMake Version %s",pcVar3);
  sVar2 = strlen(local_4b8);
  sVar2 = lVar5 - sVar2;
  if (sVar2 != 0) {
    memset(local_438,0x20,sVar2);
  }
  strcpy(local_438 + sVar2,local_4b8);
  local_438[lVar5] = '\0';
  local_4ba = 0;
  local_4bc = 0x7325;
  move(iVar6 + -4,0);
  wattr_on(_stdscr,0x10000,0);
  printw(&local_4bc,acStack_239 + 1);
  wattr_off(_stdscr,0x10000,0);
  move(iVar6 + -3,0);
  printw(&local_4bc,local_438);
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesLongMessageForm::UpdateStatusBar()
{
  int x,y;
  getmaxyx(stdscr, y, x);

  char bar[cmCursesMainForm::MAX_WIDTH];
  size_t size = strlen(this->Title.c_str());
  if ( size >= cmCursesMainForm::MAX_WIDTH )
    {
    size = cmCursesMainForm::MAX_WIDTH-1;
    }
  strncpy(bar, this->Title.c_str(), size);
  for(size_t i=size-1; i<cmCursesMainForm::MAX_WIDTH; i++) bar[i] = ' ';

  int width;
  if (x < cmCursesMainForm::MAX_WIDTH )
    {
    width = x;
    }
  else
    {
    width = cmCursesMainForm::MAX_WIDTH-1;
    }

  bar[width] = '\0';

  char version[cmCursesMainForm::MAX_WIDTH];
  char vertmp[128];
  sprintf(vertmp,"CMake Version %s", cmVersion::GetCMakeVersion());
  size_t sideSpace = (width-strlen(vertmp));
  for(size_t i=0; i<sideSpace; i++) { version[i] = ' '; }
  sprintf(version+sideSpace, "%s", vertmp);
  version[width] = '\0';

  char fmt_s[] = "%s";
  curses_move(y-4,0);
  attron(A_STANDOUT);
  printw(fmt_s, bar);
  attroff(A_STANDOUT);
  curses_move(y-3,0);
  printw(fmt_s, version);
  pos_form_cursor(this->Form);
}